

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  long lVar1;
  FieldDescriptor *this_00;
  bool bVar2;
  CppType CVar3;
  DescriptorPool *pDVar4;
  mapped_type *ppTVar5;
  mapped_type pTVar6;
  MessageFactory *pMVar7;
  undefined4 extraout_var;
  pointer __p;
  LogMessage *pLVar8;
  char *pcVar9;
  DynamicMessage *this_01;
  Reflection *this_02;
  int i;
  DescriptorPool *pDVar10;
  int i_1;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  Descriptor *pDVar17;
  ulong uVar18;
  int j;
  LogFinisher local_91;
  Descriptor *type_local;
  pointer local_88;
  mapped_type local_80;
  DynamicMessageFactory *local_78;
  long local_70;
  undefined1 local_68 [24];
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  type_local = type;
  if ((this->delegate_to_generated_factory_ == true) &&
     (pDVar10 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10),
     pDVar4 = DescriptorPool::generated_pool(), pDVar10 == pDVar4)) {
    pMVar7 = MessageFactory::generated_factory();
    iVar12 = (*pMVar7->_vptr_MessageFactory[2])(pMVar7,type);
    return (Message *)CONCAT44(extraout_var,iVar12);
  }
  ppTVar5 = std::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(this->prototypes_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_false>
                            ._M_head_impl,&type_local);
  if (*ppTVar5 == (mapped_type)0x0) {
    pTVar6 = (mapped_type)operator_new(0x58);
    pTVar6->offsets =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    pTVar6->has_bits_indices =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    pTVar6->reflection =
         (__uniq_ptr_data<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>,_true,_true>
          )0x0;
    pTVar6->prototype = (DynamicMessage *)0x0;
    *ppTVar5 = pTVar6;
    pTVar6->type = type_local;
    pDVar10 = this->pool_;
    if (pDVar10 == (DescriptorPool *)0x0) {
      pDVar10 = *(DescriptorPool **)(*(long *)(type_local + 0x10) + 0x10);
    }
    pTVar6->pool = pDVar10;
    pTVar6->factory = this;
    uVar18 = ((long)*(int *)(type_local + 0x6c) + (long)*(int *)(type_local + 0x68)) * 4;
    if ((int)((long)*(int *)(type_local + 0x6c) + (long)*(int *)(type_local + 0x68)) < 0) {
      uVar18 = 0xffffffffffffffff;
    }
    local_78 = this;
    local_88 = (pointer)operator_new__(uVar18);
    std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
              ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
               &pTVar6->offsets,local_88);
    pDVar17 = type_local;
    iVar12 = 0x20;
    if (*(int *)(*(long *)(type_local + 0x10) + 0x3c) == 3) {
      pTVar6->has_bits_offset = -1;
    }
    else {
      pTVar6->has_bits_offset = 0x20;
      iVar15 = *(int *)(type_local + 0x68);
      iVar12 = ((iVar15 + 0x1f) / 0x20) * 4 + 0x27;
      uVar18 = (long)iVar15 * 4;
      if ((long)iVar15 < 0) {
        uVar18 = 0xffffffffffffffff;
      }
      __p = (pointer)operator_new__(uVar18);
      for (lVar11 = 0; lVar11 < *(int *)(pDVar17 + 0x68); lVar11 = lVar11 + 1) {
        __p[lVar11] = (uint)lVar11;
      }
      iVar12 = iVar12 - iVar12 % 8;
      std::__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>::reset
                ((__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                 &pTVar6->has_bits_indices,__p);
    }
    iVar15 = *(int *)(type_local + 0x6c);
    if (0 < iVar15) {
      pTVar6->oneof_case_offset = iVar12;
      iVar12 = iVar12 + iVar15 * 4 + 7;
      iVar12 = iVar12 - iVar12 % 8;
    }
    if (*(int *)(type_local + 0x78) < 1) {
      iVar15 = -1;
      iVar13 = iVar12;
    }
    else {
      iVar13 = (iVar12 + 0x1f) - (iVar12 + 0x1f) % 8;
      iVar15 = iVar12;
    }
    pTVar6->extensions_offset = iVar15;
    lVar16 = 0;
    pDVar17 = type_local;
    local_80 = pTVar6;
    for (lVar11 = 0; lVar11 < *(int *)(pDVar17 + 0x68); lVar11 = lVar11 + 1) {
      lVar1 = *(long *)(pDVar17 + 0x28);
      if (*(long *)(lVar1 + 0x58 + lVar16) == 0) {
        iVar12 = *(int *)(lVar1 + 0x3c + lVar16);
        CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)(lVar1 + lVar16));
        if (iVar12 == 3) {
          iVar12 = 0x10;
          iVar15 = 8;
          if (7 < CVar3 - CPPTYPE_INT32) {
            if (CVar3 == CPPTYPE_STRING) {
              iVar12 = 0x18;
            }
            else {
              if (CVar3 != CPPTYPE_MESSAGE) goto LAB_002cd9ab;
              bVar2 = FieldDescriptor::is_map((FieldDescriptor *)(lVar1 + lVar16));
              iVar12 = 0x18;
              if (bVar2) {
                iVar12 = 0x68;
              }
            }
            iVar15 = 8;
          }
        }
        else if (CVar3 - CPPTYPE_INT32 < 10) {
          iVar12 = *(int *)(&DAT_0055f880 + (ulong)(CVar3 - CPPTYPE_INT32) * 4);
          iVar15 = iVar12;
        }
        else {
LAB_002cd9ab:
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
                     ,0xab);
          pLVar8 = internal::LogMessage::operator<<((LogMessage *)local_68,"Can\'t get here.");
          internal::LogFinisher::operator=(&local_91,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
          iVar12 = 0;
          iVar15 = 0;
        }
        iVar13 = iVar13 + iVar15 + -1;
        uVar14 = iVar13 - iVar13 % iVar15;
        local_88[lVar11] = uVar14;
        iVar13 = uVar14 + iVar12;
        pDVar17 = type_local;
      }
      lVar16 = lVar16 + 0x98;
    }
    pLVar8 = (LogMessage *)0x0;
    while( true ) {
      iVar12 = *(int *)(pDVar17 + 0x6c);
      uVar14 = (iVar13 + 7) - (iVar13 + 7) % 8;
      if (iVar12 <= (int)pLVar8) break;
      local_88[(long)&pLVar8->level_ + (long)*(int *)(pDVar17 + 0x68)] = uVar14;
      iVar13 = uVar14 + 8;
      pLVar8 = (LogMessage *)((long)&pLVar8->level_ + 1);
    }
    local_80->internal_metadata_offset = uVar14;
    local_80->weak_field_map_offset = -1;
    iVar15 = uVar14 + 8;
    local_80->size = iVar15;
    if (0 < iVar12) {
      lVar11 = 0;
      while (lVar11 < iVar12) {
        local_70 = lVar11;
        for (lVar16 = 0; lVar16 < *(int *)(*(long *)(pDVar17 + 0x30) + 0x18 + lVar11 * 0x30);
            lVar16 = lVar16 + 1) {
          this_00 = *(FieldDescriptor **)
                     (*(long *)(*(long *)(pDVar17 + 0x30) + lVar11 * 0x30 + 0x20) + lVar16 * 8);
          CVar3 = FieldDescriptor::cpp_type(this_00);
          if (CVar3 - CPPTYPE_INT32 < 10) {
            iVar12 = *(int *)(&DAT_0055f880 + (ulong)(CVar3 - CPPTYPE_INT32) * 4);
          }
          else {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
                       ,0xd1);
            pLVar8 = internal::LogMessage::operator<<((LogMessage *)local_68,"Can\'t get here.");
            internal::LogFinisher::operator=(&local_91,pLVar8);
            internal::LogMessage::~LogMessage((LogMessage *)local_68);
            iVar12 = 0;
          }
          iVar13 = iVar15 + iVar12 + -1;
          iVar15 = iVar13 % iVar12;
          uVar14 = iVar13 - iVar15;
          pcVar9 = FieldDescriptor::index(this_00,(char *)pLVar8,iVar15);
          local_88[(int)pcVar9] = uVar14;
          iVar15 = uVar14 + iVar12;
          pDVar17 = type_local;
        }
        iVar12 = *(int *)(pDVar17 + 0x6c);
        lVar11 = local_70 + 1;
      }
    }
    pTVar6 = local_80;
    uVar18 = (ulong)((iVar15 + 7) - (iVar15 + 7) % 8);
    this_01 = (DynamicMessage *)operator_new(uVar18);
    memset(this_01,0,uVar18);
    DynamicMessage::DynamicMessage(this_01,pTVar6,false);
    if (0 < *(int *)(type_local + 0x6c)) {
      ConstructDefaultOneofInstance
                (pTVar6->type,
                 (pTVar6->offsets)._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                 super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,this_01);
    }
    local_68._0_8_ = pTVar6->prototype;
    local_68._8_8_ =
         (pTVar6->offsets)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_68._16_8_ =
         (pTVar6->has_bits_indices)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_50 = pTVar6->has_bits_offset;
    iStack_44 = pTVar6->oneof_case_offset;
    iStack_4c = pTVar6->internal_metadata_offset;
    iStack_48 = pTVar6->extensions_offset;
    local_40._M_allocated_capacity._0_4_ = pTVar6->size;
    local_40._M_allocated_capacity._4_4_ = pTVar6->weak_field_map_offset;
    this_02 = (Reflection *)operator_new(0x50);
    Reflection::Reflection
              (this_02,pTVar6->type,(ReflectionSchema *)local_68,pTVar6->pool,
               &local_78->super_MessageFactory);
    std::
    __uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ::reset((__uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
             *)&pTVar6->reflection,this_02);
    DynamicMessage::CrossLinkPrototypes(this_01);
  }
  else {
    this_01 = (*ppTVar5)->prototype;
  }
  return &this_01->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const DynamicMessage::TypeInfo** target = &prototypes_->map_[type];
  if (*target != NULL) {
    // Already exists.
    return (*target)->prototype;
  }

  DynamicMessage::TypeInfo* type_info = new DynamicMessage::TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == NULL) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.

  // Compute size and offsets.
  uint32* offsets = new uint32[type->field_count() + type->oneof_decl_count()];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  if (type->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    type_info->has_bits_offset = -1;
  } else {
    type_info->has_bits_offset = size;
    int has_bits_array_size =
        DivideRoundingUp(type->field_count(), bitsizeof(uint32));
    size += has_bits_array_size * sizeof(uint32);
    size = AlignOffset(size);

    uint32* has_bits_indices = new uint32[type->field_count()];
    for (int i = 0; i < type->field_count(); i++) {
      has_bits_indices[i] = i;
    }
    type_info->has_bits_indices.reset(has_bits_indices);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (type->oneof_decl_count() > 0) {
    type_info->oneof_case_offset = size;
    size += type->oneof_decl_count() * sizeof(uint32);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  int num_weak_fields = 0;
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!type->field(i)->containing_oneof()) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  // Add the InternalMetadataWithArena to the end.
  size = AlignOffset(size);
  type_info->internal_metadata_offset = size;
  size += sizeof(InternalMetadataWithArena);

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  if (type->oneof_decl_count() > 0) {
    // Compute the size of default oneof instance and offsets of default
    // oneof fields.
    for (int i = 0; i < type->oneof_decl_count(); i++) {
      for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = type->oneof_decl(i)->field(j);
        int field_size = OneofFieldSpaceUsed(field);
        size = AlignTo(size, std::min(kSafeAlignment, field_size));
        offsets[field->index()] = size;
        size += field_size;
      }
    }
  }
  size = AlignOffset(size);
  // Allocate the prototype + oneof fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  if (type->oneof_decl_count() > 0 || num_weak_fields > 0) {
    // Construct default oneof instance.
    ConstructDefaultOneofInstance(type_info->type, type_info->offsets.get(),
                                  prototype);
  }

  internal::ReflectionSchema schema = {type_info->prototype,
                                       type_info->offsets.get(),
                                       type_info->has_bits_indices.get(),
                                       type_info->has_bits_offset,
                                       type_info->internal_metadata_offset,
                                       type_info->extensions_offset,
                                       type_info->oneof_case_offset,
                                       type_info->size,
                                       type_info->weak_field_map_offset};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}